

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O3

int main(int argc,char **argv)

{
  long lVar1;
  size_t n_1;
  long lVar2;
  size_t n;
  long lVar3;
  
  lVar3 = 0;
  do {
    lVar2 = 0;
    do {
      lVar1 = lVar2 + 1;
      lVar2 = lVar2 + 1;
    } while ((&PTR_anon_var_dwarf_27_00103df0)[lVar3][lVar1] != '\0');
    printf("\'%s\' is %zu characters long.\n");
    lVar3 = lVar3 + 1;
  } while (lVar3 != 4);
  return 0;
}

Assistant:

int main(int argc, char** argv) {
  char* strings[1024] = {
    "bread",
    "The night sky is bright.",
    "Are we there yet?",
    "🐺"
  };

  for (size_t n = 0; n < 4; n++) {
    printf("'%s' is %zu characters long.\n", strings[n], my_strlen(strings[n]));
  }

  return 0;
}